

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

uint __thiscall CTransaction::GetTotalSize(CTransaction *this)

{
  long lVar1;
  size_t sVar2;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  TransactionSerParams *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TransactionSerParams::operator()(in_stack_ffffffffffffffe8,in_RDI);
  sVar2 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint)sVar2;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CTransaction::GetTotalSize() const
{
    return ::GetSerializeSize(TX_WITH_WITNESS(*this));
}